

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O3

int __thiscall MeCab::Dictionary::open(Dictionary *this,char *__file,int __oflag,...)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mmap<char> *pMVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  Token *pTVar8;
  ostream *poVar9;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  whatlog *pwVar13;
  char *r;
  
  Mmap<char>::close((this->dmmap_).ptr_,(int)__file);
  pcVar12 = (char *)(this->filename_)._M_string_length;
  strlen(__file);
  std::__cxx11::string::_M_replace((ulong)&this->filename_,0,pcVar12,(ulong)__file);
  iVar7 = Mmap<char>::open((this->dmmap_).ptr_,__file,__oflag);
  if ((char)iVar7 == '\0') {
    pwVar13 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar13,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar13,"(",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)pwVar13,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"dmmap_->open(file, mode)",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    pcVar12 = "no such file or directory: ";
  }
  else {
    pMVar4 = (this->dmmap_).ptr_;
    uVar5 = pMVar4->length;
    if (uVar5 < 100) {
      pwVar13 = &this->what_;
      std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pwVar13,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar13,"(",1);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)pwVar13,0x52);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
      pcVar12 = "dmmap_->size() >= 100";
      lVar11 = 0x15;
    }
    else {
      puVar6 = (uint *)pMVar4->text;
      if (uVar5 == ((ulong)*puVar6 ^ 0xef718f77)) {
        uVar1 = puVar6[1];
        this->version_ = uVar1;
        if (uVar1 != 0x66) {
          pwVar13 = &this->what_;
          std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pwVar13,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar13,"(",1);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)pwVar13,0x62);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"version_ == DIC_VERSION",0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"incompatible version: ",0x16);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          return 0;
        }
        this->type_ = puVar6[2];
        this->lexsize_ = puVar6[3];
        this->lsize_ = puVar6[4];
        this->rsize_ = puVar6[5];
        uVar1 = puVar6[6];
        uVar2 = puVar6[7];
        uVar3 = puVar6[8];
        this->charset_ = (char *)(puVar6 + 10);
        Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
        ::clear(&this->da_);
        (this->da_).array_ = (unit_t *)(puVar6 + 0x12);
        (this->da_).no_delete_ = true;
        (this->da_).size_ = 0;
        pTVar8 = (Token *)((long)puVar6 + (ulong)uVar1 + 0x48);
        this->token_ = pTVar8;
        pcVar12 = (char *)((long)&pTVar8->lcAttr + (ulong)uVar2);
        this->feature_ = pcVar12;
        pMVar4 = (this->dmmap_).ptr_;
        if (pcVar12 + uVar3 == pMVar4->text + pMVar4->length) {
          return (int)CONCAT71((int7)((ulong)__file >> 8),1);
        }
        pwVar13 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar13,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar13,"(",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)pwVar13,0x7a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
        pcVar12 = "ptr == dmmap_->end()";
        lVar11 = 0x14;
      }
      else {
        pwVar13 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pwVar13,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar13,"(",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)pwVar13,0x5e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") [",3);
        pcVar12 = "(magic ^ DictionaryMagicID) == dmmap_->size()";
        lVar11 = 0x2d;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,lVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
    pcVar12 = "dictionary file is broken: ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,0x1b);
  if (__file == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar10 = strlen(__file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,__file,sVar10);
  }
  return 0;
}

Assistant:

bool Dictionary::open(const char *file, const char *mode) {
  close();
  filename_.assign(file);
  CHECK_FALSE(dmmap_->open(file, mode))
      << "no such file or directory: " << file;

  CHECK_FALSE(dmmap_->size() >= 100)
      << "dictionary file is broken: " << file;

  const char *ptr = dmmap_->begin();

  unsigned int dsize;
  unsigned int tsize;
  unsigned int fsize;
  unsigned int magic;
  unsigned int dummy;

  read_static<unsigned int>(&ptr, magic);
  CHECK_FALSE((magic ^ DictionaryMagicID) == dmmap_->size())
      << "dictionary file is broken: " << file;

  read_static<unsigned int>(&ptr, version_);
  CHECK_FALSE(version_ == DIC_VERSION)
      << "incompatible version: " << version_;

  read_static<unsigned int>(&ptr, type_);
  read_static<unsigned int>(&ptr, lexsize_);
  read_static<unsigned int>(&ptr, lsize_);
  read_static<unsigned int>(&ptr, rsize_);
  read_static<unsigned int>(&ptr, dsize);
  read_static<unsigned int>(&ptr, tsize);
  read_static<unsigned int>(&ptr, fsize);
  read_static<unsigned int>(&ptr, dummy);

  charset_ = ptr;
  ptr += 32;
  da_.set_array(reinterpret_cast<void *>(const_cast<char*>(ptr)));

  ptr += dsize;

  token_ = reinterpret_cast<const Token *>(ptr);
  ptr += tsize;

  feature_ = ptr;
  ptr += fsize;

  CHECK_FALSE(ptr == dmmap_->end())
      << "dictionary file is broken: " << file;

  return true;
}